

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

void __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::put
          (_legacy_pool_policy *this,application *app)

{
  ulong uVar1;
  
  if (app != (application *)0x0) {
    uVar1 = this->size_;
    if (this->limit_ <= uVar1) {
      (*app->_vptr_application[1])(app);
      uVar1 = this->size_;
    }
    this->size_ = uVar1 + 1;
    (this->apps_).super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar1] = app;
  }
  return;
}

Assistant:

virtual void put(application *app)
	{
		if(!app)
			return;
		// must never heppen start
		if(size_ >= limit_)
			delete app;
		// must never happend end
		apps_[size_++] = app;
	}